

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::PoolingParameter::set_pool(PoolingParameter *this,PoolingParameter_PoolMethod value)

{
  if (value < (PoolingParameter_PoolMethod_STOCHASTIC|PoolingParameter_PoolMethod_AVE)) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
    this->pool_ = value;
    return;
  }
  __assert_fail("::caffe::PoolingParameter_PoolMethod_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x50e0,
                "void caffe::PoolingParameter::set_pool(::caffe::PoolingParameter_PoolMethod)");
}

Assistant:

bool PoolingParameter_PoolMethod_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}